

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

fxp_names * fxp_readdir_recv(sftp_packet *pktin,sftp_request *req)

{
  BinarySource *src;
  unsigned_long factor1;
  fxp_names *ptr;
  fxp_name *pfVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  ptrlen pVar6;
  
  safefree(req);
  if (pktin->type == 0x68) {
    src = pktin->binarysource_;
    factor1 = BinarySource_get_uint32(src);
    if ((pktin->binarysource_[0].err == BSE_NO_ERROR) &&
       (factor1 <= (pktin->binarysource_[0].len - pktin->binarysource_[0].pos) / 0xc)) {
      if (factor1 < 0x1c71c72) {
        lVar5 = 0x10;
        ptr = (fxp_names *)safemalloc(1,0x10,0);
        ptr->nnames = (int)factor1;
        pfVar1 = (fxp_name *)safemalloc(factor1,0x48,0);
        ptr->names = pfVar1;
        for (uVar4 = 0; uVar2 = (ulong)ptr->nnames, uVar4 < uVar2; uVar4 = uVar4 + 1) {
          pVar6 = BinarySource_get_string(src);
          pcVar3 = mkstr(pVar6);
          *(char **)((long)ptr->names + lVar5 + -0x10) = pcVar3;
          pVar6 = BinarySource_get_string(src);
          pcVar3 = mkstr(pVar6);
          pfVar1 = ptr->names;
          *(char **)((long)pfVar1 + lVar5 + -8) = pcVar3;
          BinarySource_get_fxp_attrs(src,(fxp_attrs *)((long)&pfVar1->filename + lVar5));
          lVar5 = lVar5 + 0x48;
        }
        if (pktin->binarysource_[0].err != BSE_NO_ERROR) {
          fxp_errtype = -1;
          fxp_error_message = "malformed FXP_NAME packet";
          lVar5 = 0;
          for (uVar4 = 0; uVar4 < (ulong)(long)(int)uVar2; uVar4 = uVar4 + 1) {
            safefree(*(void **)((long)&ptr->names->filename + lVar5));
            safefree(*(void **)((long)&ptr->names->longname + lVar5));
            uVar2 = (ulong)(uint)ptr->nnames;
            lVar5 = lVar5 + 0x48;
          }
          safefree(ptr->names);
          safefree(ptr);
          safefree(pktin);
          return (fxp_names *)0x0;
        }
        sftp_pkt_free(pktin);
        return ptr;
      }
      fxp_error_message = "unreasonably large FXP_NAME packet";
    }
    else {
      fxp_error_message = "malformed FXP_NAME packet";
    }
    fxp_errtype = -1;
  }
  else {
    fxp_got_status(pktin);
  }
  sftp_pkt_free(pktin);
  return (fxp_names *)0x0;
}

Assistant:

struct fxp_names *fxp_readdir_recv(struct sftp_packet *pktin,
                                   struct sftp_request *req)
{
    sfree(req);
    if (pktin->type == SSH_FXP_NAME) {
        struct fxp_names *ret;
        unsigned long i;

        i = get_uint32(pktin);

        /*
         * Sanity-check the number of names. Minimum is obviously
         * zero. Maximum is the remaining space in the packet
         * divided by the very minimum length of a name, which is
         * 12 bytes (4 for an empty filename, 4 for an empty
         * longname, 4 for a set of attribute flags indicating that
         * no other attributes are supplied).
         */
        if (get_err(pktin) || i > get_avail(pktin) / 12) {
            fxp_internal_error("malformed FXP_NAME packet");
            sftp_pkt_free(pktin);
            return NULL;
        }

        /*
         * Ensure the implicit multiplication in the snewn() call
         * doesn't suffer integer overflow and cause us to malloc
         * too little space.
         */
        if (i > INT_MAX / sizeof(struct fxp_name)) {
            fxp_internal_error("unreasonably large FXP_NAME packet");
            sftp_pkt_free(pktin);
            return NULL;
        }

        ret = snew(struct fxp_names);
        ret->nnames = i;
        ret->names = snewn(ret->nnames, struct fxp_name);
        for (i = 0; i < (unsigned long)ret->nnames; i++) {
            ret->names[i].filename = mkstr(get_string(pktin));
            ret->names[i].longname = mkstr(get_string(pktin));
            get_fxp_attrs(pktin, &ret->names[i].attrs);
        }

        if (get_err(pktin)) {
            fxp_internal_error("malformed FXP_NAME packet");
            for (i = 0; i < (unsigned long)ret->nnames; i++) {
                sfree(ret->names[i].filename);
                sfree(ret->names[i].longname);
            }
            sfree(ret->names);
            sfree(ret);
            sfree(pktin);
            return NULL;
        }
        sftp_pkt_free(pktin);
        return ret;
    } else {
        fxp_got_status(pktin);
        sftp_pkt_free(pktin);
        return NULL;
    }
}